

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O3

void av1_filter_block_plane_vert_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  undefined1 use_filter_type;
  int dst_stride;
  uint8_t *puVar1;
  MB_MODE_INFO **ppMVar2;
  MB_MODE_INFO *pMVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  loop_filter_info_n *lfi_n;
  ulong uVar11;
  uint uVar12;
  MB_MODE_INFO *pMVar13;
  uint8_t *dst;
  byte bVar14;
  uint uVar15;
  byte *pbVar16;
  int iVar17;
  int iVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  AV1_DEBLOCKING_PARAMETERS *pAVar22;
  char cVar23;
  
  uVar21 = (ulong)mi_col;
  iVar8 = ((plane_ptr->dst).height + 3 >> 2) - mi_row;
  iVar17 = 1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  if (iVar8 < iVar17) {
    iVar17 = iVar8;
  }
  iVar18 = ((plane_ptr->dst).width + 3 >> 2) - mi_col;
  iVar8 = 0x20;
  if (iVar18 < 0x20) {
    iVar8 = iVar18;
  }
  if (0 < iVar17) {
    puVar1 = (plane_ptr->dst).buf;
    dst_stride = (plane_ptr->dst).stride;
    lfi_n = &cm->lf_info;
    uVar15 = 0;
    do {
      uVar12 = uVar15 + mi_row;
      params_buf->filter_length = '\0';
      uVar9 = (cm->mi_params).mi_stride * uVar12;
      ppMVar2 = (cm->mi_params).mi_grid_base;
      pMVar3 = ppMVar2[uVar9 + uVar21];
      cVar23 = (char)*(ushort *)&pMVar3->field_0xa7;
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) {
        bVar19 = pMVar3->tx_size;
        if (((cVar23 < '\0') || ('\0' < pMVar3->ref_frame[0])) && (pMVar3->skip_txfm == '\0')) {
          uVar11 = (ulong)pMVar3->bsize;
          bVar19 = pMVar3->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [uVar11] - 1 & mi_col) >>
                    (av1_get_txb_size_index_tw_w_log2_table[uVar11] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [uVar11] - 1 & uVar12) >>
                     (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar11) & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[uVar11] & 0x1f))];
        }
        if (mi_col != 0) {
          pMVar13 = ppMVar2[(ulong)uVar9 + (uVar21 - 1)];
          if (xd != (MACROBLOCKD *)0x0) goto LAB_0038fafd;
          cVar5 = (char)*(undefined2 *)&pMVar13->field_0xa7;
LAB_0038fb3b:
          bVar7 = pMVar13->tx_size;
          if (((cVar5 < '\0') || ('\0' < pMVar13->ref_frame[0])) && (pMVar13->skip_txfm == '\0')) {
            uVar11 = (ulong)pMVar13->bsize;
            bVar7 = pMVar13->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [uVar11] - 1 & mi_col - 1) >>
                     (av1_get_txb_size_index_tw_w_log2_table[uVar11] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [uVar11] - 1 & uVar12) >>
                      (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar11) & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[uVar11] & 0x1f))];
          }
          goto LAB_0038fbb3;
        }
        bVar14 = 0x80;
      }
      else if (mi_col == 0) {
        bVar14 = 0x80;
        bVar19 = 0;
      }
      else {
        pMVar13 = ppMVar2[(ulong)uVar9 + (uVar21 - 1)];
        bVar19 = 0;
LAB_0038fafd:
        cVar5 = (char)*(ushort *)&pMVar13->field_0xa7;
        if (xd->lossless[*(ushort *)&pMVar13->field_0xa7 & 7] == 0) goto LAB_0038fb3b;
        bVar7 = 0;
LAB_0038fbb3:
        bVar14 = block_size_high[pMVar13->bsize];
        bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar3);
        if (bVar6 == 0) {
          bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar13);
        }
        if (pMVar13 == pMVar3) {
          if (pMVar3->skip_txfm == '\0') {
            bVar4 = true;
          }
          else {
            if (cVar23 < '\0') goto LAB_0038fc5d;
            bVar4 = pMVar3->ref_frame[0] < '\x01';
          }
          if (!bVar4) goto LAB_0038fc5d;
        }
        if (bVar6 != 0) {
          params_buf->filter_length = (uint8_t)vert_filter_length_luma[bVar19][bVar7];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
        }
      }
LAB_0038fc5d:
      bVar7 = block_size_high[pMVar3->bsize];
      if (bVar14 < block_size_high[pMVar3->bsize]) {
        bVar7 = bVar14;
      }
      *tx_buf = bVar19;
      iVar20 = tx_size_wide_unit[bVar19];
      uVar9 = mi_col + iVar20;
      if (uVar9 < iVar8 + mi_col) {
        pbVar16 = tx_buf + iVar20;
        pAVar22 = params_buf + iVar20;
        do {
          pAVar22->filter_length = '\0';
          uVar10 = (cm->mi_params).mi_stride * uVar12;
          ppMVar2 = (cm->mi_params).mi_grid_base;
          pMVar3 = ppMVar2[(ulong)uVar10 + (ulong)uVar9];
          cVar23 = (char)*(ushort *)&pMVar3->field_0xa7;
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0))
          {
            bVar14 = pMVar3->tx_size;
            if (((cVar23 < '\0') || ('\0' < pMVar3->ref_frame[0])) && (pMVar3->skip_txfm == '\0')) {
              uVar11 = (ulong)pMVar3->bsize;
              bVar14 = pMVar3->inter_tx_size
                       [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [uVar11] - 1 & uVar9) >>
                        (av1_get_txb_size_index_tw_w_log2_table[uVar11] & 0x1f)) +
                        (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [uVar11] - 1 & uVar12) >>
                         (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar11) & 0x1f))
                        << (av1_get_txb_size_index_stride_log2_table[uVar11] & 0x1f))];
            }
          }
          else {
            bVar14 = 0;
          }
          pMVar13 = ppMVar2[(ulong)uVar10 + ((ulong)uVar9 - 1)];
          bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar3);
          if (bVar6 == 0) {
            bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar13);
          }
          if (pMVar13 == pMVar3) {
            if (pMVar3->skip_txfm == '\0') {
              bVar4 = true;
LAB_0038fdf2:
              if (bVar4) goto joined_r0x0038fdf8;
            }
            else if (-1 < cVar23) {
              bVar4 = pMVar3->ref_frame[0] < '\x01';
              goto LAB_0038fdf2;
            }
          }
          else {
joined_r0x0038fdf8:
            if (bVar6 != 0) {
              pAVar22->filter_length = (uint8_t)vert_filter_length_luma[bVar14][bVar19];
              pAVar22->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
            }
          }
          if (block_size_high[pMVar3->bsize] <= bVar7) {
            bVar7 = block_size_high[pMVar3->bsize];
          }
          *pbVar16 = bVar14;
          iVar20 = tx_size_wide_unit[bVar14];
          uVar9 = uVar9 + iVar20;
          pbVar16 = pbVar16 + iVar20;
          pAVar22 = pAVar22 + iVar20;
          bVar19 = bVar14;
        } while (uVar9 < iVar8 + mi_col);
      }
      if (((((uVar15 & 3) != 0) || (uVar9 = uVar15 | 3, iVar17 <= (int)uVar9)) || (bVar7 < 0x10)) &&
         (uVar9 = uVar15 + 1, bVar7 < 8 || iVar17 <= (int)(uVar15 + 1))) {
        uVar9 = uVar15;
      }
      if (0 < iVar18) {
        dst = puVar1 + (int)(uVar15 * dst_stride * 4);
        iVar20 = 0;
        pbVar16 = tx_buf;
        pAVar22 = params_buf;
        do {
          if (*pbVar16 == 0xff) {
            pAVar22->filter_length = '\0';
            *pbVar16 = 0;
          }
          use_filter_type = cm->seq_params->use_highbitdepth;
          filter_vert(dst,dst_stride,pAVar22,(SequenceHeader *)(ulong)cm->seq_params->bit_depth,
                      use_filter_type);
          uVar15 = tx_size_wide_unit[*pbVar16];
          iVar20 = iVar20 + uVar15;
          dst = dst + uVar15 * 4;
          pbVar16 = pbVar16 + uVar15;
          pAVar22 = pAVar22 + uVar15;
        } while (iVar20 < iVar8);
      }
      uVar15 = uVar9 + 1;
    } while ((int)uVar15 < iVar17);
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  // Whenever 'pipeline_lpf_mt_with_enc' is enabled, height of the unit to
  // filter (i.e., y_range) is calculated based on the size of the superblock
  // used.
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  // Width of the unit to filter (i.e., x_range) should always be calculated
  // based on maximum superblock size as this function is called for mi_col = 0,
  // MAX_MIB_SIZE, 2 * MAX_MIB_SIZE etc.
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);
  const ptrdiff_t mode_step = 1;
  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + y;
    const uint32_t x_start = mi_col;
    const uint32_t x_end = mi_col + x_range;
    int min_block_height = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                     x_start, curr_y, plane_ptr, x_end,
                                     mode_step, &min_block_height);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + y * MI_SIZE * dst_stride;

    if ((y & 3) == 0 && (y + 3) < y_range && min_block_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      use_filter_type = USE_QUAD;
      y += 3;
    } else if ((y + 1) < y_range && min_block_height >= 8) {
      use_filter_type = USE_DUAL;
      y += 1;
    }

    for (int x = 0; x < x_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_vert(p, dst_stride, params, cm->seq_params, use_filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      p += advance_units * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}